

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

string * cmCTestTestHandler::FindExecutable
                   (string *__return_storage_ptr__,cmCTest *ctest,char *testCommand,
                   string *resultingConfig,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *extraPaths,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *failed)

{
  pointer pcVar1;
  char *pcVar2;
  string *psVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  pointer pbVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  string fullPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  attempted;
  string filepath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  attemptedConfigs;
  string filename;
  string tempPath;
  string localfilepath;
  undefined1 auStack_308 [8];
  string local_300;
  cmCTest *local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  string *local_2c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2b8;
  string *local_2b0;
  long *local_2a8;
  long local_298 [2];
  string local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  string local_250;
  string local_230;
  char *local_210;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [8];
  pointer pbStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  local_230._M_string_length = 0;
  local_230.field_2._M_local_buf[0] = '\0';
  local_2e0 = ctest;
  local_2b8 = failed;
  local_2b0 = resultingConfig;
  std::__cxx11::string::string((string *)local_1a8,testCommand,(allocator *)&local_250);
  cmsys::SystemTools::GetFilenamePath(&local_288,(string *)local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string((string *)local_1a8,testCommand,(allocator *)&local_300);
  cmsys::SystemTools::GetFilenameName(&local_250,(string *)local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_288._M_dataplus._M_p,
             local_288._M_dataplus._M_p + local_288._M_string_length);
  AddConfigurations(local_2e0,&local_2d8,&local_268,&local_1c8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  local_2c0 = __return_storage_ptr__;
  local_210 = testCommand;
  if ((local_288._M_string_length != 0) && (*local_288._M_dataplus._M_p == '/')) {
    std::__cxx11::string::substr((ulong)local_1a8,(ulong)&local_288);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e8,local_1a8,
               (char *)((long)local_1a8 + (long)&pbStack_1a0->_M_dataplus));
    AddConfigurations(local_2e0,&local_2d8,&local_268,&local_1e8,&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
  }
  if ((local_288._M_string_length == 0) &&
     (pbVar7 = (extraPaths->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
     (extraPaths->
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     )._M_impl.super__Vector_impl_data._M_finish != pbVar7)) {
    uVar9 = 1;
    uVar8 = 0;
    do {
      cmsys::SystemTools::GetFilenamePath((string *)local_1a8,pbVar7 + uVar8);
      cmsys::SystemTools::GetFilenameName
                (&local_300,
                 (extraPaths->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar8);
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_208,local_1a8,
                 (char *)((long)local_1a8 + (long)&pbStack_1a0->_M_dataplus));
      AddConfigurations(local_2e0,&local_2d8,&local_268,&local_208,&local_300);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,
                        CONCAT71(local_300.field_2._M_allocated_capacity._1_7_,
                                 local_300.field_2._M_local_buf[0]) + 1);
      }
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
      }
      uVar8 = (ulong)uVar9;
      pbVar7 = (extraPaths->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar9 = uVar9 + 1;
    } while (uVar8 < (ulong)((long)(extraPaths->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5))
    ;
  }
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  local_300._M_string_length = 0;
  local_300.field_2._M_local_buf[0] = '\0';
  if (local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar8 = 0;
    uVar10 = 1;
    do {
      bVar4 = cmsys::SystemTools::FileExists
                        (local_2d8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p);
      if (bVar4) {
        bVar4 = cmsys::SystemTools::FileIsDirectory
                          (local_2d8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar8);
        if (bVar4) goto LAB_002bdce3;
        cmsys::SystemTools::CollapseFullPath
                  ((string *)local_1a8,
                   local_2d8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar8);
LAB_002bdd5e:
        std::__cxx11::string::operator=((string *)&local_300,(string *)local_1a8);
        if (local_1a8 != (undefined1  [8])local_198) {
          operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_assign((string *)local_2b0);
      }
      else {
LAB_002bdce3:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_2b8,
                    local_2d8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar8);
        std::__cxx11::string::_M_assign((string *)&local_230);
        cmsys::SystemTools::GetExecutableExtension();
        std::__cxx11::string::append((char *)&local_230);
        bVar4 = cmsys::SystemTools::FileExists(local_230._M_dataplus._M_p);
        if (bVar4) {
          bVar4 = cmsys::SystemTools::FileIsDirectory(&local_230);
          if (!bVar4) {
            cmsys::SystemTools::CollapseFullPath((string *)local_1a8,&local_230);
            goto LAB_002bdd5e;
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_2b8,&local_230);
      }
    } while ((uVar10 < (ulong)((long)local_2d8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2d8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5)) &&
            (uVar8 = uVar10, uVar10 = (ulong)((int)uVar10 + 1), local_300._M_string_length == 0));
  }
  pcVar2 = local_210;
  psVar3 = local_2c0;
  if (local_288._M_string_length == 0 && local_300._M_string_length == 0) {
    local_1a8 = (undefined1  [8])0x0;
    pbStack_1a0 = (pointer)0x0;
    local_198[0]._M_allocated_capacity = 0;
    cmsys::SystemTools::FindProgram
              (local_2c0,local_250._M_dataplus._M_p,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1a8,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a8);
    iVar5 = std::__cxx11::string::compare((char *)psVar3);
    if (iVar5 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)local_2b0,0,(char *)local_2b0->_M_string_length,0x5e5069);
      goto LAB_002be0d4;
    }
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &psVar3->field_2) {
      operator_delete(pcVar1,(psVar3->field_2)._M_allocated_capacity + 1);
    }
  }
  if (local_300._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Could not find executable ",0x1a);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)auStack_308 + (int)*(undefined8 *)((long)local_1a8 + -0x18) + 0x160);
    }
    else {
      sVar6 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Looked in the following places:\n",0x20);
    std::__cxx11::stringbuf::str();
    cmCTest::Log(local_2e0,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x5ff,(char *)local_2a8,false);
    if (local_2a8 != local_298) {
      operator_delete(local_2a8,local_298[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    pbVar7 = (local_2b8->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (pbVar7 != (local_2b8->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        pcVar2 = (pbVar7->_M_dataplus)._M_p;
        if (pcVar2 == (char *)0x0) {
          std::ios::clear((int)auStack_308 + (int)*(undefined8 *)((long)local_1a8 + -0x18) + 0x160);
        }
        else {
          sVar6 = strlen(pcVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        std::__cxx11::stringbuf::str();
        cmCTest::Log(local_2e0,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                     ,0x603,(char *)local_2a8,false);
        if (local_2a8 != local_298) {
          operator_delete(local_2a8,local_298[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != (local_2b8->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  (local_2c0->_M_dataplus)._M_p = (pointer)&local_2c0->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p == &local_300.field_2) {
    (local_2c0->field_2)._M_allocated_capacity =
         CONCAT71(local_300.field_2._M_allocated_capacity._1_7_,local_300.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&local_2c0->field_2 + 8) = local_300.field_2._8_8_;
  }
  else {
    (local_2c0->_M_dataplus)._M_p = local_300._M_dataplus._M_p;
    (local_2c0->field_2)._M_allocated_capacity =
         CONCAT71(local_300.field_2._M_allocated_capacity._1_7_,local_300.field_2._M_local_buf[0]);
  }
  local_2c0->_M_string_length = local_300._M_string_length;
  local_300._M_string_length = 0;
  local_300.field_2._M_local_buf[0] = '\0';
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
LAB_002be0d4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,
                    CONCAT71(local_300.field_2._M_allocated_capacity._1_7_,
                             local_300.field_2._M_local_buf[0]) + 1);
  }
  psVar3 = local_2c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,
                    CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                             local_230.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d8);
  return psVar3;
}

Assistant:

std::string cmCTestTestHandler
::FindExecutable(cmCTest *ctest,
                 const char *testCommand,
                 std::string &resultingConfig,
                 std::vector<std::string> &extraPaths,
                 std::vector<std::string> &failed)
{
  // now run the compiled test if we can find it
  std::vector<std::string> attempted;
  std::vector<std::string> attemptedConfigs;
  std::string tempPath;
  std::string filepath =
    cmSystemTools::GetFilenamePath(testCommand);
  std::string filename =
    cmSystemTools::GetFilenameName(testCommand);

  cmCTestTestHandler::AddConfigurations(ctest, attempted,
                                        attemptedConfigs,
                                        filepath,filename);

  // even if a fullpath was specified also try it relative to the current
  // directory
  if (!filepath.empty() && filepath[0] == '/')
    {
    std::string localfilepath = filepath.substr(1,filepath.size()-1);
    cmCTestTestHandler::AddConfigurations(ctest, attempted,
                                          attemptedConfigs,
                                          localfilepath,filename);
    }


  // if extraPaths are provided and we were not passed a full path, try them,
  // try any extra paths
  if (filepath.empty())
    {
    for (unsigned int i = 0; i < extraPaths.size(); ++i)
      {
      std::string filepathExtra =
        cmSystemTools::GetFilenamePath(extraPaths[i]);
      std::string filenameExtra =
        cmSystemTools::GetFilenameName(extraPaths[i]);
      cmCTestTestHandler::AddConfigurations(ctest,attempted,
                                            attemptedConfigs,
                                            filepathExtra,
                                            filenameExtra);
      }
    }

  // store the final location in fullPath
  std::string fullPath;

  // now look in the paths we specified above
  for(unsigned int ai=0;
      ai < attempted.size() && fullPath.empty(); ++ai)
    {
    // first check without exe extension
    if(cmSystemTools::FileExists(attempted[ai].c_str())
       && !cmSystemTools::FileIsDirectory(attempted[ai]))
      {
      fullPath = cmSystemTools::CollapseFullPath(attempted[ai]);
      resultingConfig = attemptedConfigs[ai];
      }
    // then try with the exe extension
    else
      {
      failed.push_back(attempted[ai]);
      tempPath = attempted[ai];
      tempPath += cmSystemTools::GetExecutableExtension();
      if(cmSystemTools::FileExists(tempPath.c_str())
         && !cmSystemTools::FileIsDirectory(tempPath))
        {
        fullPath = cmSystemTools::CollapseFullPath(tempPath);
        resultingConfig = attemptedConfigs[ai];
        }
      else
        {
        failed.push_back(tempPath);
        }
      }
    }

  // if everything else failed, check the users path, but only if a full path
  // wasn't specified
  if (fullPath.empty() && filepath.empty())
    {
    std::string path = cmSystemTools::FindProgram(filename.c_str());
    if (path != "")
      {
      resultingConfig = "";
      return path;
      }
    }
  if(fullPath.empty())
    {
    cmCTestLog(ctest, HANDLER_OUTPUT,
               "Could not find executable " << testCommand << "\n"
               << "Looked in the following places:\n");
    for(std::vector<std::string>::iterator i = failed.begin();
        i != failed.end(); ++i)
      {
      cmCTestLog(ctest, HANDLER_OUTPUT, i->c_str() << "\n");
      }
    }

  return fullPath;
}